

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

LY_ERR lyd_validate_choice_r
                 (lyd_node **first,lysc_node *sparent,lys_module *mod,lysc_ext_instance *ext,
                 uint32_t val_opts,uint32_t int_opts,ly_ht *getnext_ht,lyd_node **diff)

{
  long lVar1;
  bool bVar2;
  uint local_4c;
  uint32_t i;
  lysc_node **snodes;
  lysc_node **choices;
  LY_ERR rc;
  LY_ERR r;
  uint32_t int_opts_local;
  uint32_t val_opts_local;
  lysc_ext_instance *ext_local;
  lys_module *mod_local;
  lysc_node *sparent_local;
  lyd_node **first_local;
  
  choices._0_4_ = 0;
  rc = int_opts;
  r = val_opts;
  _int_opts_local = ext;
  ext_local = (lysc_ext_instance *)mod;
  mod_local = (lys_module *)sparent;
  sparent_local = (lysc_node *)first;
  choices._0_4_ =
       lyd_val_getnext_get(sparent,mod,ext,(byte)int_opts & 4,getnext_ht,&snodes,
                           (lysc_node ***)&stack0xffffffffffffffb8);
  if (((LY_ERR)choices == LY_SUCCESS) && (snodes != (lysc_node **)0x0)) {
    local_4c = 0;
    while( true ) {
      lVar1._0_2_ = sparent_local->nodetype;
      lVar1._2_2_ = sparent_local->flags;
      lVar1._4_1_ = sparent_local->hash[0];
      lVar1._5_1_ = sparent_local->hash[1];
      lVar1._6_1_ = sparent_local->hash[2];
      lVar1._7_1_ = sparent_local->hash[3];
      bVar2 = false;
      if (lVar1 != 0) {
        bVar2 = snodes[local_4c] != (lysc_node *)0x0;
      }
      if (((!bVar2) ||
          ((choices._4_4_ =
                 lyd_validate_cases((lyd_node **)sparent_local,(lys_module *)ext_local,
                                    (lysc_node_choice *)snodes[local_4c],diff),
           choices._4_4_ != LY_SUCCESS &&
           ((choices._0_4_ = choices._4_4_, choices._4_4_ != LY_EVALID ||
            ((r & LY_EEXIST) == LY_SUCCESS)))))) ||
         ((choices._4_4_ =
                lyd_validate_choice_r
                          ((lyd_node **)sparent_local,snodes[local_4c],(lys_module *)ext_local,
                           _int_opts_local,r,rc,getnext_ht,diff), choices._4_4_ != LY_SUCCESS &&
          ((choices._0_4_ = choices._4_4_, choices._4_4_ != LY_EVALID ||
           ((r & LY_EEXIST) == LY_SUCCESS)))))) break;
      local_4c = local_4c + 1;
    }
  }
  return (LY_ERR)choices;
}

Assistant:

static LY_ERR
lyd_validate_choice_r(struct lyd_node **first, const struct lysc_node *sparent, const struct lys_module *mod,
        const struct lysc_ext_instance *ext, uint32_t val_opts, uint32_t int_opts, struct ly_ht *getnext_ht,
        struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    const struct lysc_node **choices, **snodes;
    uint32_t i;

    /* get cached getnext schema nodes */
    rc = lyd_val_getnext_get(sparent, mod, ext, int_opts & LYD_INTOPT_REPLY, getnext_ht, &choices, &snodes);
    LY_CHECK_GOTO(rc, cleanup);
    if (!choices) {
        goto cleanup;
    }

    for (i = 0; *first && choices[i]; ++i) {
        /* check case duplicites */
        r = lyd_validate_cases(first, mod, (struct lysc_node_choice *)choices[i], diff);
        LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

        /* check for nested choice */
        r = lyd_validate_choice_r(first, choices[i], mod, ext, val_opts, int_opts, getnext_ht, diff);
        LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);
    }

cleanup:
    return rc;
}